

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::dimensions_abi_cxx11_(string *__return_storage_ptr__,units *this,precise_unit *units)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  precise_unit base;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  precise_unit local_40;
  
  if (((byte)this[0xb] & 0x10) == 0) {
    iVar4 = detail::unit_data::unit_type_count((unit_data *)(this + 8));
    if (iVar4 != 0) {
      local_40.base_units_ = *(unit_data *)(this + 8);
      local_40.multiplier_ = 1.0;
      local_40.commodity_ = 0;
      paVar1 = &__return_storage_ptr__->field_2;
      lVar10 = 0;
      do {
        bVar3 = precise_unit::operator==(&local_40,(precise_unit *)(&DAT_001b0660 + lVar10));
        if (bVar3) {
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"[","");
          plVar5 = (long *)std::__cxx11::string::append((char *)local_60);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_70 = *plVar6;
            lStack_68 = plVar5[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar6;
            local_80 = (long *)*plVar5;
          }
          local_78 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar7) {
            lVar2 = plVar5[3];
            paVar1->_M_allocated_capacity = *psVar7;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          }
          __return_storage_ptr__->_M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
          if (bVar3) {
            return __return_storage_ptr__;
          }
        }
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x1788);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      pcVar9 = "[unknown]";
      pcVar8 = "";
      goto LAB_00168d28;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar9 = "[dimensionless]";
  pcVar8 = "";
LAB_00168d28:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string dimensions(const precise_unit& units)
{
    if (units.is_per_unit() || units.unit_type_count() == 0) {
        return "[dimensionless]";
    }

    precise_unit base(1.0, units.base_units());
    for (const auto& mt : defined_measurement_types) {
        if (base == mt.second) {
            return std::string("[") + mt.first + "]";
        }
    }
    // Now it isn't something common so lets just build a sequence TODO(PT):
    return "[unknown]";
}